

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::InterCallTestCase
          (InterCallTestCase *this,Context *context,char *name,char *desc,StorageType storage,
          int flags,InterCallOperations *ops)

{
  int flags_local;
  StorageType storage_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  InterCallTestCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InterCallTestCase_011c48f8;
  this->m_storage = storage;
  this->m_invocationGridSize = 0x200;
  this->m_perInvocationSize = 2;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
  ::vector(&this->m_cmds,&ops->m_cmds);
  this->m_useAtomic = (flags & 1U) != 0;
  this->m_formatInteger = (flags & 2U) != 0;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::vector
            (&this->m_operationPrograms);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_operationResultStorages)
  ;
  std::map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::map(&this->m_storageIDs);
  return;
}

Assistant:

InterCallTestCase::InterCallTestCase (Context& context, const char* name, const char* desc, StorageType storage, int flags, const InterCallOperations& ops)
	: TestCase					(context, name, desc)
	, m_storage					(storage)
	, m_invocationGridSize		(512)
	, m_perInvocationSize		(2)
	, m_cmds					(ops.m_cmds)
	, m_useAtomic				((flags & FLAG_USE_ATOMIC) != 0)
	, m_formatInteger			((flags & FLAG_USE_INT) != 0)
{
}